

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int print_keyword(yang_token keyword,yang_arg arg,FILE *out,int level,FILE *in,char **buf,
                 int *buf_len)

{
  byte bVar1;
  bool bVar2;
  char **buf_00;
  int iVar3;
  yang_token yVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *ptr;
  yang_arg local_5c;
  char **ppcStack_58;
  yang_arg arg_local;
  ulong local_50;
  char *local_48;
  FILE *local_40;
  undefined4 local_34;
  
  local_5c = arg;
  local_40 = (FILE *)out;
  if (0x44 < keyword - YANG_ANYXML) {
switchD_001039b0_caseD_24:
    print_keyword_cold_2();
    return -1;
  }
  uVar11 = (ulong)(uint)level;
  pcVar12 = "text";
  switch(keyword) {
  case YANG_ANYXML:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<anyxml name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "anyxml";
    break;
  case YANG_ARGUMENT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<argument name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "argument";
    break;
  case YANG_AUGMENT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<augment target-node=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "augment";
    break;
  case YANG_BASE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<base name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "base";
    break;
  case YANG_BELONGS_TO:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<belongs-to module=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "belongs-to";
    break;
  case YANG_BIT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<bit name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "bit";
    break;
  case YANG_CASE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<case name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "case";
    break;
  case YANG_CHOICE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<choice name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "choice";
    break;
  case YANG_CONFIG:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<config value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "config";
    break;
  case YANG_CONTACT:
    local_48 = "contact";
    pcVar6 = "%*s<contact>\n";
    goto LAB_0010438f;
  case YANG_CONTAINER:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<container name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "container";
    break;
  case YANG_DEFAULT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<default value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "default";
    break;
  case YANG_DESCRIPTION:
    local_48 = "description";
    pcVar6 = "%*s<description>\n";
    goto LAB_0010438f;
  case YANG_DEVIATE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<deviate value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "deviate";
    break;
  case YANG_DEVIATION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<deviation target-node=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "deviation";
    break;
  case YANG_ENUM:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<enum name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "enum";
    break;
  case YANG_ERROR_APP_TAG:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<error-app-tag value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "error-app-tag";
    break;
  case YANG_ERROR_MESSAGE:
    local_48 = "error-message";
    pcVar12 = "value";
    pcVar6 = "%*s<error-message>\n";
    goto LAB_0010438f;
  case YANG_EXTENSION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<extension name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "extension";
    break;
  case YANG_FEATURE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<feature name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "feature";
    break;
  case YANG_FRACTION_DIGITS:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<fraction-digits value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "fraction-digits";
    break;
  case YANG_GROUPING:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<grouping name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "grouping";
    break;
  case YANG_IDENTITY:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<identity name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "identity";
    break;
  case YANG_IF_FEATURE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<if-feature name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "if-feature";
    break;
  case YANG_IMPORT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<import module=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "import";
    break;
  case YANG_INCLUDE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<include module=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "include";
    break;
  case YANG_INPUT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<input",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "input";
    break;
  case YANG_KEY:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<key value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "key";
    break;
  case YANG_LEAF:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<leaf name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "leaf";
    break;
  case YANG_LEAF_LIST:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<leaf-list name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "leaf-list";
    break;
  case YANG_LENGTH:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<length value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "length";
    break;
  case YANG_LIST:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<list name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "list";
    break;
  case YANG_MANDATORY:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<mandatory value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "mandatory";
    break;
  case YANG_MAX_ELEMENTS:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<max-elements value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "max-elements";
    break;
  case YANG_MIN_ELEMENTS:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<min-elements value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "min-elements";
    break;
  default:
    goto switchD_001039b0_caseD_24;
  case YANG_MUST:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<must condition=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "must";
    break;
  case YANG_NAMESPACE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<namespace uri=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "namespace";
    break;
  case YANG_NOTIFICATION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<notification name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "notification";
    break;
  case YANG_ORDERED_BY:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<ordered-by value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "ordered-by";
    break;
  case YANG_ORGANIZATION:
    local_48 = "organization";
    pcVar6 = "%*s<organization>\n";
    goto LAB_0010438f;
  case YANG_OUTPUT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<output",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "output";
    break;
  case YANG_PATH:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<path value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "path";
    break;
  case YANG_PATTERN:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<pattern value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "pattern";
    break;
  case YANG_POSITION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    pcVar6 = "%*s<position value=\"";
    goto LAB_00103fe4;
  case YANG_PREFIX:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<prefix value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "prefix";
    break;
  case YANG_PRESENCE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<presence value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "presence";
    break;
  case YANG_RANGE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<range value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "range";
    break;
  case YANG_REFERENCE:
    local_48 = "reference";
    pcVar6 = "%*s<reference>\n";
LAB_0010438f:
    local_50 = CONCAT44(local_50._4_4_,arg);
    pcVar9 = " ";
    pcVar8 = " ";
    if (level == 0) {
      pcVar8 = "";
    }
    local_34 = 0;
    ppcStack_58 = buf;
    fprintf((FILE *)out,pcVar6,(ulong)(uint)(level * 2),pcVar8);
    uVar10 = level + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 0) {
      pcVar9 = "";
    }
    fprintf((FILE *)out,"%*s<%s>",(ulong)(uVar10 * 2),pcVar9,pcVar12);
    buf = ppcStack_58;
    arg = (yang_arg)local_50;
    goto LAB_0010491a;
  case YANG_REFINE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<refine target-node=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "refine";
    break;
  case YANG_REQUIRE_INSTANCE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<require-instance value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "require-instance";
    break;
  case YANG_REVISION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<revision date=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "revision";
    break;
  case YANG_REVISION_DATE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<revision-date date=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "revision-date";
    break;
  case YANG_RPC:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<rpc name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "rpc";
    break;
  case YANG_STATUS:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<status value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "status";
    break;
  case YANG_TYPE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<type name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "type";
    break;
  case YANG_TYPEDEF:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<typedef name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "typedef";
    break;
  case YANG_UNIQUE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<unique tag=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "unique";
    break;
  case YANG_UNITS:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<units name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "units";
    break;
  case YANG_USES:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<uses name=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "uses";
    break;
  case YANG_VALUE:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    pcVar6 = "%*s<value value=\"";
LAB_00103fe4:
    iVar3 = fprintf((FILE *)out,pcVar6,(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "value";
    break;
  case YANG_WHEN:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<when condition=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "condition";
    break;
  case YANG_YANG_VERSION:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<yang-version value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "yang-version";
    break;
  case YANG_YIN_ELEMENT:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<yin-element value=\"",(ulong)(uint)(level * 2),pcVar12);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "yin-element";
    break;
  case YANG_CUSTOM:
    pcVar12 = " ";
    if (level == 0) {
      pcVar12 = "";
    }
    iVar3 = fprintf((FILE *)out,"%*s<%s",(ulong)(uint)(level * 2),pcVar12,*buf);
    local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    local_48 = "!!error!!";
  }
  pcVar12 = (char *)0x0;
LAB_0010491a:
  if (arg == Y_STR_ARG) {
    pbVar7 = (byte *)get_word(in,buf,buf_len);
    if (pbVar7 != (byte *)0x0) {
      ppcStack_58 = buf;
      local_50 = uVar11;
      if ((char)local_34 == '\0') {
        do {
          bVar1 = *pbVar7;
          if (bVar1 < 0x3c) {
            if (bVar1 == 0x26) {
              pcVar6 = "&amp;";
              goto LAB_00104a51;
            }
            if (bVar1 == 0) goto LAB_00104a71;
LAB_00104a60:
            fputc((int)(char)bVar1,local_40);
          }
          else {
            if (bVar1 == 0x3e) {
              pcVar6 = "&gt;";
            }
            else {
              if (bVar1 != 0x3c) goto LAB_00104a60;
              pcVar6 = "&lt;";
            }
LAB_00104a51:
            fputs(pcVar6,local_40);
          }
          pbVar7 = pbVar7 + 1;
        } while( true );
      }
      do {
        bVar1 = *pbVar7;
        if (bVar1 < 0x3c) {
          if (bVar1 == 0x22) {
            pcVar6 = "&quot;";
            goto LAB_001049f7;
          }
          if (bVar1 == 0x26) {
            pcVar6 = "&amp;";
            goto LAB_001049f7;
          }
          if (bVar1 == 0) goto LAB_00104a71;
LAB_00104a09:
          fputc((int)(char)bVar1,local_40);
        }
        else {
          if (bVar1 == 0x3e) {
            pcVar6 = "&gt;";
          }
          else {
            if (bVar1 != 0x3c) goto LAB_00104a09;
            pcVar6 = "&lt;";
          }
LAB_001049f7:
          fputs(pcVar6,local_40);
        }
        pbVar7 = pbVar7 + 1;
      } while( true );
    }
  }
  else {
    if (arg == Y_IDENTIF_ARG) {
      pcVar6 = get_word(in,buf,buf_len);
      if (pcVar6 == (char *)0x0) {
        return -1;
      }
      pcVar8 = "";
      if ((char)local_34 != '\0') {
        pcVar8 = "\"";
      }
      fprintf(local_40,"%s%s",pcVar6,pcVar8);
    }
    bVar2 = true;
    ppcStack_58 = buf;
    if ((char)local_34 == '\0') {
LAB_00104a96:
      bVar2 = false;
      fprintf(local_40,"</%s>\n",pcVar12);
      uVar11 = (ulong)((int)uVar11 - 1);
    }
LAB_00104ab1:
    pcVar12 = get_word(in,ppcStack_58,buf_len);
    if (pcVar12 != (char *)0x0) {
      yVar4 = get_keyword(pcVar12,&local_5c);
      iVar3 = (int)uVar11;
      if ((int)yVar4 < 0x43) {
        if (yVar4 == YANG_SEMICOLON) {
          if (bVar2) {
            fwrite("/>\n",3,1,local_40);
            return 0;
          }
          goto LAB_00104bc5;
        }
        if (yVar4 == YANG_UNKNOWN) {
LAB_00104c29:
          fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar12);
          return -1;
        }
      }
      else {
        if (yVar4 == YANG_LEFT_BRACE) {
          if (bVar2) {
            fwrite(">\n",2,1,local_40);
          }
          buf_00 = ppcStack_58;
          local_50 = uVar11;
          while( true ) {
            pcVar12 = get_word(in,buf_00,buf_len);
            if (pcVar12 == (char *)0x0) {
              return -1;
            }
            yVar4 = get_keyword(pcVar12,&local_5c);
            if (yVar4 == YANG_RIGHT_BRACE) break;
            if (yVar4 == YANG_UNKNOWN) goto LAB_00104c29;
            iVar5 = print_keyword(yVar4,local_5c,(FILE *)local_40,iVar3 + 1,in,buf_00,buf_len);
            if (iVar5 != 0) {
              return -1;
            }
          }
          iVar3 = (int)local_50;
LAB_00104bc5:
          pcVar12 = " ";
          if (iVar3 == 0) {
            pcVar12 = "";
          }
          fprintf(local_40,"%*s</%s>\n",(ulong)(uint)(iVar3 * 2),pcVar12,local_48);
          return 0;
        }
        if (yVar4 == YANG_RIGHT_BRACE) {
          return 0;
        }
      }
      print_keyword_cold_1();
    }
  }
  return -1;
LAB_00104a71:
  uVar11 = local_50;
  if ((char)local_34 == '\0') goto LAB_00104a96;
  fputc(0x22,local_40);
  bVar2 = true;
  goto LAB_00104ab1;
}

Assistant:

static int
print_keyword(enum yang_token keyword, enum yang_arg arg, FILE *out, int level, FILE *in, char **buf, int *buf_len)
{
    char *word;
    const char *yin_element = NULL, *close_tag;

    switch (keyword) {
    case YANG_ANYXML:
        fprintf(out, "%*s<anyxml name=\"", LEVEL(level), INDENT(level));
        close_tag = "anyxml";
        break;
    case YANG_ARGUMENT:
        fprintf(out, "%*s<argument name=\"", LEVEL(level), INDENT(level));
        close_tag = "argument";
        break;
    case YANG_AUGMENT:
        fprintf(out, "%*s<augment target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "augment";
        break;
    case YANG_BASE:
        fprintf(out, "%*s<base name=\"", LEVEL(level), INDENT(level));
        close_tag = "base";
        break;
    case YANG_BELONGS_TO:
        fprintf(out, "%*s<belongs-to module=\"", LEVEL(level), INDENT(level));
        close_tag = "belongs-to";
        break;
    case YANG_BIT:
        fprintf(out, "%*s<bit name=\"", LEVEL(level), INDENT(level));
        close_tag = "bit";
        break;
    case YANG_CASE:
        fprintf(out, "%*s<case name=\"", LEVEL(level), INDENT(level));
        close_tag = "case";
        break;
    case YANG_CHOICE:
        fprintf(out, "%*s<choice name=\"", LEVEL(level), INDENT(level));
        close_tag = "choice";
        break;
    case YANG_CONFIG:
        fprintf(out, "%*s<config value=\"", LEVEL(level), INDENT(level));
        close_tag = "config";
        break;
    case YANG_CONTACT:
        fprintf(out, "%*s<contact>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "contact";
        break;
    case YANG_CONTAINER:
        fprintf(out, "%*s<container name=\"", LEVEL(level), INDENT(level));
        close_tag = "container";
        break;
    case YANG_DEFAULT:
        fprintf(out, "%*s<default value=\"", LEVEL(level), INDENT(level));
        close_tag = "default";
        break;
    case YANG_DESCRIPTION:
        fprintf(out, "%*s<description>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "description";
        break;
    case YANG_DEVIATE:
        fprintf(out, "%*s<deviate value=\"", LEVEL(level), INDENT(level));
        close_tag = "deviate";
        break;
    case YANG_DEVIATION:
        fprintf(out, "%*s<deviation target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "deviation";
        break;
    case YANG_ENUM:
        fprintf(out, "%*s<enum name=\"", LEVEL(level), INDENT(level));
        close_tag = "enum";
        break;
    case YANG_ERROR_APP_TAG:
        fprintf(out, "%*s<error-app-tag value=\"", LEVEL(level), INDENT(level));
        close_tag = "error-app-tag";
        break;
    case YANG_ERROR_MESSAGE:
        fprintf(out, "%*s<error-message>\n", LEVEL(level), INDENT(level));
        yin_element = "value";
        close_tag = "error-message";
        break;
    case YANG_EXTENSION:
        fprintf(out, "%*s<extension name=\"", LEVEL(level), INDENT(level));
        close_tag = "extension";
        break;
    case YANG_FEATURE:
        fprintf(out, "%*s<feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "feature";
        break;
    case YANG_FRACTION_DIGITS:
        fprintf(out, "%*s<fraction-digits value=\"", LEVEL(level), INDENT(level));
        close_tag = "fraction-digits";
        break;
    case YANG_GROUPING:
        fprintf(out, "%*s<grouping name=\"", LEVEL(level), INDENT(level));
        close_tag = "grouping";
        break;
    case YANG_IDENTITY:
        fprintf(out, "%*s<identity name=\"", LEVEL(level), INDENT(level));
        close_tag = "identity";
        break;
    case YANG_IF_FEATURE:
        fprintf(out, "%*s<if-feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "if-feature";
        break;
    case YANG_IMPORT:
        fprintf(out, "%*s<import module=\"", LEVEL(level), INDENT(level));
        close_tag = "import";
        break;
    case YANG_INCLUDE:
        fprintf(out, "%*s<include module=\"", LEVEL(level), INDENT(level));
        close_tag = "include";
        break;
    case YANG_INPUT:
        fprintf(out, "%*s<input", LEVEL(level), INDENT(level));
        close_tag = "input";
        break;
    case YANG_KEY:
        fprintf(out, "%*s<key value=\"", LEVEL(level), INDENT(level));
        close_tag = "key";
        break;
    case YANG_LEAF:
        fprintf(out, "%*s<leaf name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf";
        break;
    case YANG_LEAF_LIST:
        fprintf(out, "%*s<leaf-list name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf-list";
        break;
    case YANG_LENGTH:
        fprintf(out, "%*s<length value=\"", LEVEL(level), INDENT(level));
        close_tag = "length";
        break;
    case YANG_LIST:
        fprintf(out, "%*s<list name=\"", LEVEL(level), INDENT(level));
        close_tag = "list";
        break;
    case YANG_MANDATORY:
        fprintf(out, "%*s<mandatory value=\"", LEVEL(level), INDENT(level));
        close_tag = "mandatory";
        break;
    case YANG_MAX_ELEMENTS:
        fprintf(out, "%*s<max-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "max-elements";
        break;
    case YANG_MIN_ELEMENTS:
        fprintf(out, "%*s<min-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "min-elements";
        break;
    case YANG_MUST:
        fprintf(out, "%*s<must condition=\"", LEVEL(level), INDENT(level));
        close_tag = "must";
        break;
    case YANG_NAMESPACE:
        fprintf(out, "%*s<namespace uri=\"", LEVEL(level), INDENT(level));
        close_tag = "namespace";
        break;
    case YANG_NOTIFICATION:
        fprintf(out, "%*s<notification name=\"", LEVEL(level), INDENT(level));
        close_tag = "notification";
        break;
    case YANG_ORDERED_BY:
        fprintf(out, "%*s<ordered-by value=\"", LEVEL(level), INDENT(level));
        close_tag = "ordered-by";
        break;
    case YANG_ORGANIZATION:
        fprintf(out, "%*s<organization>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "organization";
        break;
    case YANG_OUTPUT:
        fprintf(out, "%*s<output", LEVEL(level), INDENT(level));
        close_tag = "output";
        break;
    case YANG_PATH:
        fprintf(out, "%*s<path value=\"", LEVEL(level), INDENT(level));
        close_tag = "path";
        break;
    case YANG_PATTERN:
        fprintf(out, "%*s<pattern value=\"", LEVEL(level), INDENT(level));
        close_tag = "pattern";
        break;
    case YANG_POSITION:
        fprintf(out, "%*s<position value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_PREFIX:
        fprintf(out, "%*s<prefix value=\"", LEVEL(level), INDENT(level));
        close_tag = "prefix";
        break;
    case YANG_PRESENCE:
        fprintf(out, "%*s<presence value=\"", LEVEL(level), INDENT(level));
        close_tag = "presence";
        break;
    case YANG_RANGE:
        fprintf(out, "%*s<range value=\"", LEVEL(level), INDENT(level));
        close_tag = "range";
        break;
    case YANG_REFERENCE:
        fprintf(out, "%*s<reference>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "reference";
        break;
    case YANG_REFINE:
        fprintf(out, "%*s<refine target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "refine";
        break;
    case YANG_REQUIRE_INSTANCE:
        fprintf(out, "%*s<require-instance value=\"", LEVEL(level), INDENT(level));
        close_tag = "require-instance";
        break;
    case YANG_REVISION:
        fprintf(out, "%*s<revision date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision";
        break;
    case YANG_REVISION_DATE:
        fprintf(out, "%*s<revision-date date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision-date";
        break;
    case YANG_RPC:
        fprintf(out, "%*s<rpc name=\"", LEVEL(level), INDENT(level));
        close_tag = "rpc";
        break;
    case YANG_STATUS:
        fprintf(out, "%*s<status value=\"", LEVEL(level), INDENT(level));
        close_tag = "status";
        break;
    case YANG_TYPE:
        fprintf(out, "%*s<type name=\"", LEVEL(level), INDENT(level));
        close_tag = "type";
        break;
    case YANG_TYPEDEF:
        fprintf(out, "%*s<typedef name=\"", LEVEL(level), INDENT(level));
        close_tag = "typedef";
        break;
    case YANG_UNIQUE:
        fprintf(out, "%*s<unique tag=\"", LEVEL(level), INDENT(level));
        close_tag = "unique";
        break;
    case YANG_UNITS:
        fprintf(out, "%*s<units name=\"", LEVEL(level), INDENT(level));
        close_tag = "units";
        break;
    case YANG_USES:
        fprintf(out, "%*s<uses name=\"", LEVEL(level), INDENT(level));
        close_tag = "uses";
        break;
    case YANG_VALUE:
        fprintf(out, "%*s<value value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_WHEN:
        fprintf(out, "%*s<when condition=\"", LEVEL(level), INDENT(level));
        close_tag = "condition";
        break;
    case YANG_YANG_VERSION:
        fprintf(out, "%*s<yang-version value=\"", LEVEL(level), INDENT(level));
        close_tag = "yang-version";
        break;
    case YANG_YIN_ELEMENT:
        fprintf(out, "%*s<yin-element value=\"", LEVEL(level), INDENT(level));
        close_tag = "yin-element";
        break;
    case YANG_CUSTOM:
        /* it must still be stored in buf */
        fprintf(out, "%*s<%s", LEVEL(level), INDENT(level), *buf);
        /* will be printed in case of some nested extension elements, we don't support that */
        close_tag = "!!error!!";
        break;
    default:
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }

    /* keyword followed by a child element */
    if (yin_element) {
        ++level;
        fprintf(out, "%*s<%s>", LEVEL(level), INDENT(level), yin_element);
    }

    /* keyword argument */
    switch (arg) {
    case Y_IDENTIF_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }

        /* word is the identifier (after some changes) */
        fprintf(out, "%s%s", word, (yin_element ? "" : "\""));
        break;

    case Y_STR_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }
        /* word is the string */
        if (yin_element) {
            print_text_xml_encode(out, word);
        } else {
            print_attr_val_xml_encode(out, word);
        }

        if (!yin_element) {
            fprintf(out, "\"");
        }
        break;

    case Y_NO_ARG:
        break;
    }

    if (yin_element) {
        fprintf(out, "</%s>\n", yin_element);
        --level;
    }

    word = get_word(in, buf, buf_len);
    if (!word) {
        return -1;
    }
    keyword = get_keyword(word, &arg);
    if (!keyword) {
        fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
        return -1;
    }

    if (keyword == YANG_LEFT_BRACE) {
        if (!yin_element) {
            fprintf(out, ">\n");
        }

        while (1) {
            word = get_word(in, buf, buf_len);
            if (!word) {
                return -1;
            }
            keyword = get_keyword(word, &arg);
            if (!keyword) {
                fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
                return -1;
            }

            if (keyword == YANG_RIGHT_BRACE) {
                break;
            }

            if (print_keyword(keyword, arg, out, level + 1, in, buf, buf_len)) {
                return -1;
            }
        }

        fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
    }
    if ((keyword != YANG_SEMICOLON) && (keyword != YANG_RIGHT_BRACE)) {
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }
    if (keyword == YANG_SEMICOLON) {
        if (yin_element) {
            fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
        } else {
            fprintf(out, "/>\n");
        }
    }

    return 0;
}